

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergePartial
               (CodedInputStream *input,Message *message)

{
  bool bVar1;
  WireType WVar2;
  int number;
  Descriptor *this;
  Reflection *this_00;
  DescriptorPool *pDVar3;
  MessageOptions *this_01;
  FieldDescriptor *pFStack_60;
  int field_number;
  FieldDescriptor *field;
  uint32_t tag;
  Reflection *message_reflection;
  Descriptor *descriptor;
  Message *message_local;
  CodedInputStream *input_local;
  uint32_t local_1c;
  uint32_t v;
  uint32_t local_c;
  
  this = Message::GetDescriptor(message);
  this_00 = Message::GetReflection(message);
  do {
    while( true ) {
      local_1c = 0;
      if ((input->buffer_ < input->buffer_end_) &&
         (local_1c = (uint32_t)*input->buffer_, local_1c < 0x80)) {
        io::CodedInputStream::Advance(input,1);
        local_c = local_1c;
      }
      else {
        local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
      }
      input->last_tag_ = local_c;
      if (local_c == 0) {
        return true;
      }
      WVar2 = WireFormatLite::GetTagWireType(local_c);
      if (WVar2 == WIRETYPE_END_GROUP) {
        return true;
      }
      pFStack_60 = (FieldDescriptor *)0x0;
      if (this != (Descriptor *)0x0) break;
LAB_00876333:
      bVar1 = ParseAndMergeField(local_c,pFStack_60,message,input);
      if (!bVar1) {
        return false;
      }
    }
    number = WireFormatLite::GetTagFieldNumber(local_c);
    pFStack_60 = Descriptor::FindFieldByNumber(this,number);
    if ((pFStack_60 == (FieldDescriptor *)0x0) &&
       (bVar1 = Descriptor::IsExtensionNumber(this,number), bVar1)) {
      pDVar3 = io::CodedInputStream::GetExtensionPool(input);
      if (pDVar3 == (DescriptorPool *)0x0) {
        pFStack_60 = Reflection::FindKnownExtensionByNumber(this_00,number);
      }
      else {
        pDVar3 = io::CodedInputStream::GetExtensionPool(input);
        pFStack_60 = DescriptorPool::FindExtensionByNumber(pDVar3,this,number);
      }
    }
    if (pFStack_60 != (FieldDescriptor *)0x0) goto LAB_00876333;
    this_01 = Descriptor::options(this);
    bVar1 = MessageOptions::message_set_wire_format(this_01);
    if ((!bVar1) || (local_c != 0xb)) goto LAB_00876333;
    bVar1 = ParseAndMergeMessageSetItem(input,message);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergePartial(io::CodedInputStream* input,
                                      Message* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* message_reflection = message->GetReflection();

  while (true) {
    uint32_t tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    if (WireFormatLite::GetTagWireType(tag) ==
        WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    const FieldDescriptor* field = nullptr;

    if (descriptor != nullptr) {
      int field_number = WireFormatLite::GetTagFieldNumber(tag);
      field = descriptor->FindFieldByNumber(field_number);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
        if (input->GetExtensionPool() == nullptr) {
          field = message_reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = input->GetExtensionPool()->FindExtensionByNumber(
              descriptor, field_number);
        }
      }

      // If that failed, but we're a MessageSet, and this is the tag for a
      // MessageSet item, then parse that.
      if (field == nullptr && descriptor->options().message_set_wire_format() &&
          tag == WireFormatLite::kMessageSetItemStartTag) {
        if (!ParseAndMergeMessageSetItem(input, message)) {
          return false;
        }
        continue;  // Skip ParseAndMergeField(); already taken care of.
      }
    }

    if (!ParseAndMergeField(tag, field, message, input)) {
      return false;
    }
  }
}